

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O1

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char **ppcVar8;
  uint uVar9;
  uint __c;
  long lVar10;
  byte local_4d;
  
  if ((prev_argv != ___argv) || (prev_argc != ___argc)) {
    argv_index = 1;
    argv_index2 = 1;
    opt_offset = 1;
    dashdash = 0;
    nonopt = 0;
    prev_argv = ___argv;
    prev_argc = ___argc;
  }
  iVar1 = prev_argc;
  ppcVar8 = prev_argv;
  local_4d = dashdash;
  lVar5 = (long)prev_argc;
  while( true ) {
    iVar2 = nonopt;
    optarg = (char *)0x0;
    if ((___argv[argv_index] != (char *)0x0) &&
       (iVar3 = strcmp(___argv[argv_index],"--"), iVar3 == 0)) {
      dashdash = 1;
      increment_index();
      local_4d = 1;
    }
    iVar3 = argv_index;
    lVar10 = (long)argv_index;
    pcVar6 = ___argv[lVar10];
    uVar9 = 0xffffffff;
    if (pcVar6 == (char *)0x0) goto LAB_001074a8;
    if ((((local_4d & 1) == 0) && (*pcVar6 == '-')) && (iVar4 = strcmp(pcVar6,"-"), iVar4 != 0))
    break;
    if (*__shortopts == '+') {
LAB_00107488:
      nonopt = ___argc - iVar3;
      goto LAB_001074a8;
    }
    if (*__shortopts == '-') {
      optarg = pcVar6;
      increment_index();
      uVar9 = 1;
      goto LAB_001074a8;
    }
    pcVar6 = getenv("POSIXLY_CORRECT");
    if (pcVar6 != (char *)0x0) goto LAB_00107488;
    if (iVar1 <= iVar3 + iVar2) goto LAB_001074a8;
    pcVar6 = ppcVar8[lVar10];
    memmove(ppcVar8 + lVar10,ppcVar8 + lVar10 + 1,(long)(~iVar3 + iVar1) << 3);
    ppcVar8[lVar5 + -1] = pcVar6;
    nonopt = iVar2 + 1;
  }
  lVar10 = (long)opt_offset;
  lVar5 = lVar10 + 1;
  opt_offset = (int)lVar5;
  __c = (uint)pcVar6[lVar10];
  pcVar7 = strchr(__shortopts + (*__shortopts == '-'),__c);
  if (pcVar7 == (char *)0x0) {
    if (opterr != 0) {
      fprintf(_stderr,"%s: invalid option -- %c\n",*___argv,(ulong)__c);
    }
    optopt = __c;
    increment_index();
    uVar9 = 0x3f;
  }
  else {
    uVar9 = __c;
    if (pcVar7[1] == ':') {
      if (pcVar6[lVar5] != '\0') {
        optarg = pcVar6 + lVar5;
        goto LAB_001075be;
      }
      if (pcVar7[2] == ':') goto LAB_001075be;
      if (argv_index2 < iVar3) {
        argv_index2 = iVar3;
      }
      ppcVar8 = ___argv + argv_index2;
      goto LAB_00107582;
    }
    if (pcVar6[lVar5] == '\0') {
      increment_index();
    }
  }
  goto LAB_001074a8;
  while (*pcVar6 == '-') {
LAB_00107582:
    argv_index2 = argv_index2 + 1;
    ppcVar8 = ppcVar8 + 1;
    pcVar6 = *ppcVar8;
    if (pcVar6 == (char *)0x0) break;
  }
  optarg = (char *)0x0;
  if (argv_index2 + nonopt < prev_argc) {
    optarg = pcVar6;
  }
LAB_001075be:
  increment_index();
  if ((optarg == (char *)0x0) && (pcVar7[2] != ':')) {
    uVar9 = 0x3f;
    optopt = __c;
    if (opterr != 0) {
      fprintf(_stderr,"%s: option requires an argument -- %c\n",*___argv,(ulong)__c);
    }
  }
LAB_001074a8:
  optind = argv_index;
  if (uVar9 == 0xffffffff) {
    optind = ___argc - nonopt;
  }
  return uVar9;
}

Assistant:

int getopt(int argc, char** argv, const char* optstr)
{
	int c = 0;

	/* If we have new argv, reinitialize */
	if(prev_argv != argv || prev_argc != argc)
	{
		/* Initialize variables */
		prev_argv = argv;
		prev_argc = argc;
		argv_index = 1;
		argv_index2 = 1;
		opt_offset = 1;
		dashdash = 0;
		nonopt = 0;
	}

	/* Jump point in case we want to ignore the current argv_index */
	getopt_top:

	/* Misc. initializations */
	optarg = NULL;

	/* Dash-dash check */
	if(argv[argv_index] && !strcmp(argv[argv_index], "--"))
	{
		dashdash = 1;
		increment_index();
	}

	/* If we're at the end of argv, that's it. */
	if(argv[argv_index] == NULL)
	{
		c = -1;
	}
	/* Are we looking at a string? Single dash is also a string */
	else if(dashdash || argv[argv_index][0] != '-' || !strcmp(argv[argv_index], "-"))
	{
		/* If we want a string... */
		if(optstr[0] == '-')
		{
			c = 1;
			optarg = argv[argv_index];
			increment_index();
		}
		/* If we really don't want it (we're in POSIX mode), we're done */
		else if(optstr[0] == '+' || getenv("POSIXLY_CORRECT"))
		{
			c = -1;

			/* Everything else is a non-opt argument */
			nonopt = argc - argv_index;
		}
		/* If we mildly don't want it, then move it back */
		else
		{
			if(!permute_argv_once()) goto getopt_top;
			else c = -1;
		}
	}
	/* Otherwise we're looking at an option */
	else
	{
		char* opt_ptr = NULL;

		/* Grab the option */
		c = argv[argv_index][opt_offset++];

		/* Is the option in the optstr? */
		if(optstr[0] == '-') opt_ptr = strchr(optstr+1, c);
		else opt_ptr = strchr(optstr, c);
		/* Invalid argument */
		if(!opt_ptr)
		{
			if(opterr)
			{
				fprintf(stderr, "%s: invalid option -- %c\n", argv[0], c);
			}

			optopt = c;
			c = '?';

			/* Move onto the next option */
			increment_index();
		}
		/* Option takes argument */
		else if(opt_ptr[1] == ':')
		{
			/* ie, -oARGUMENT, -xxxoARGUMENT, etc. */
			if(argv[argv_index][opt_offset] != '\0')
			{
				optarg = &argv[argv_index][opt_offset];
				increment_index();
			}
			/* ie, -o ARGUMENT (only if it's a required argument) */
			else if(opt_ptr[2] != ':')
			{
				/* One of those "you're not expected to understand this" moment */
				if(argv_index2 < argv_index) argv_index2 = argv_index;
				while(argv[++argv_index2] && argv[argv_index2][0] == '-');
				optarg = argv[argv_index2];

				/* Don't cross into the non-option argument list */
				if(argv_index2 + nonopt >= prev_argc) optarg = NULL;

				/* Move onto the next option */
				increment_index();
			}
			else
			{
				/* Move onto the next option */
				increment_index();
			}

			/* In case we got no argument for an option with required argument */
			if(optarg == NULL && opt_ptr[2] != ':')
			{
				optopt = c;
				c = '?';

				if(opterr)
				{
					fprintf(stderr,"%s: option requires an argument -- %c\n",
							argv[0], optopt);
				}
			}
		}
		/* Option does not take argument */
		else
		{
			/* Next argv_index */
			if(argv[argv_index][opt_offset] == '\0')
			{
				increment_index();
			}
		}
	}

	/* Calculate optind */
	if(c == -1)
	{
		optind = argc - nonopt;
	}
	else
	{
		optind = argv_index;
	}

	return c;
}